

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hash.h
# Opt level: O2

uint64_t __thiscall
slang::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>::
operator()(hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
           *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *str)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  byte *pbVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  uint8_t *p;
  ulong *puVar19;
  
  puVar19 = (ulong *)(str->_M_dataplus)._M_p;
  uVar1 = str->_M_string_length;
  if (uVar1 < 0x11) {
    uVar16 = 0xa0761d6478bd642f;
    if (uVar1 < 4) {
      if (uVar1 == 0) {
        uVar17 = 0;
      }
      else {
        uVar17 = (ulong)*(byte *)((long)puVar19 + (uVar1 - 1)) |
                 (ulong)((uint)*(byte *)((long)puVar19 + (uVar1 >> 1)) << 8 |
                        (uint)(byte)*puVar19 << 0x10);
      }
      uVar15 = 0;
    }
    else {
      uVar15 = (ulong)((uint)(uVar1 >> 1) & 0xc);
      uVar17 = CONCAT44((int)*puVar19,*(undefined4 *)((long)puVar19 + uVar15));
      pbVar14 = (byte *)((long)puVar19 + (uVar1 - 4));
      uVar15 = CONCAT44(*(undefined4 *)pbVar14,*(undefined4 *)(pbVar14 + -uVar15));
    }
  }
  else {
    uVar16 = 0xa0761d6478bd642f;
    uVar15 = uVar1;
    if (0x30 < uVar1) {
      uVar17 = 0xa0761d6478bd642f;
      uVar18 = 0xa0761d6478bd642f;
      do {
        auVar4._8_8_ = 0;
        auVar4._0_8_ = uVar16 ^ puVar19[1];
        auVar10._8_8_ = 0;
        auVar10._0_8_ = *puVar19 ^ 0xe7037ed1a0b428db;
        uVar16 = SUB168(auVar4 * auVar10,8) ^ SUB168(auVar4 * auVar10,0);
        auVar5._8_8_ = 0;
        auVar5._0_8_ = uVar17 ^ puVar19[3];
        auVar11._8_8_ = 0;
        auVar11._0_8_ = puVar19[2] ^ 0x8ebc6af09c88c6e3;
        uVar17 = SUB168(auVar5 * auVar11,8) ^ SUB168(auVar5 * auVar11,0);
        auVar6._8_8_ = 0;
        auVar6._0_8_ = uVar18 ^ puVar19[5];
        auVar12._8_8_ = 0;
        auVar12._0_8_ = puVar19[4] ^ 0x589965cc75374cc3;
        uVar18 = SUB168(auVar6 * auVar12,8) ^ SUB168(auVar6 * auVar12,0);
        puVar19 = puVar19 + 6;
        uVar15 = uVar15 - 0x30;
      } while (0x30 < uVar15);
      uVar16 = uVar17 ^ uVar16 ^ uVar18;
    }
    for (; 0x10 < uVar15; uVar15 = uVar15 - 0x10) {
      auVar7._8_8_ = 0;
      auVar7._0_8_ = uVar16 ^ puVar19[1];
      auVar13._8_8_ = 0;
      auVar13._0_8_ = *puVar19 ^ 0xe7037ed1a0b428db;
      uVar16 = SUB168(auVar7 * auVar13,8) ^ SUB168(auVar7 * auVar13,0);
      puVar19 = puVar19 + 2;
    }
    uVar17 = *(ulong *)((long)puVar19 + (uVar15 - 0x10));
    uVar15 = *(ulong *)((long)puVar19 + (uVar15 - 8));
  }
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar16 ^ uVar15;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = uVar17 ^ 0xe7037ed1a0b428db;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = SUB168(auVar2 * auVar8,0) ^ SUB168(auVar2 * auVar8,8);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = uVar1 ^ 0xe7037ed1a0b428db;
  return SUB168(auVar3 * auVar9,0) ^ SUB168(auVar3 * auVar9,8);
}

Assistant:

uint64_t operator()(const std::basic_string<CharT>& str) const noexcept {
        return detail::hashing::hash(str.data(), sizeof(CharT) * str.size());
    }